

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::RgbaInputFile::FromYca::rotateBuf2(FromYca *this,int d)

{
  long in_RDI;
  int i_1;
  int i;
  Rgba *tmp [3];
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int iVar1;
  undefined8 auStack_28 [3];
  int local_c;
  
  local_c = Imath_2_5::modp(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
    auStack_28[iVar1] = *(undefined8 *)(in_RDI + 0x150 + (long)iVar1 * 8);
  }
  for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
    *(undefined8 *)(in_RDI + 0x150 + (long)iVar1 * 8) = auStack_28[(iVar1 + local_c) % 3];
  }
  return;
}

Assistant:

void
RgbaInputFile::FromYca::rotateBuf2 (int d)
{
    d = modp (d, 3);

    Rgba *tmp[3];

    for (int i = 0; i < 3; ++i)
	tmp[i] = _buf2[i];

    for (int i = 0; i < 3; ++i)
	_buf2[i] = tmp[(i + d) % 3];
}